

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O3

void do_cmd_view_map(void)

{
  uint8_t uVar1;
  int iVar2;
  wchar_t wVar3;
  uint uVar4;
  int iVar5;
  void *p;
  long lVar6;
  level_conflict *plVar7;
  level_conflict *plVar8;
  long lVar9;
  char *pcVar10;
  byte bVar11;
  char cVar12;
  uint8_t uVar13;
  wchar_t col;
  uint uVar14;
  ulong uVar15;
  ui_event uVar16;
  wchar_t hgt;
  wchar_t wid;
  wchar_t cx;
  wchar_t cy;
  int local_70;
  int local_6c;
  long local_68;
  level_conflict *local_60;
  level_conflict *local_58;
  level_conflict *local_50;
  level_conflict *local_48;
  ulong local_40;
  wchar_t local_38;
  wchar_t local_34;
  
  Term_get_size(&local_6c,&local_70);
  screen_save();
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  Term_clear();
  uVar1 = tile_width;
  uVar13 = tile_height;
  tile_width = '\x01';
  tile_height = '\x01';
  display_map(&local_34,&local_38);
  put_str("Hit any key to continue",Term->hgt + L'\xffffffff',Term->wid / 2 + L'\xfffffff5');
  Term_gotoxy(local_38,local_34);
  anykey();
  pcVar10 = world->name;
  tile_height = uVar13;
  tile_width = uVar1;
  iVar2 = strcmp(pcVar10,"Hybrid Dungeon");
  if (((iVar2 != 0) && (iVar2 = strcmp(pcVar10,"Angband Dungeon"), iVar2 != 0)) &&
     (wVar3 = level_topography((int)player->place), wVar3 != L'\a')) {
    iVar2 = (int)player->place;
    do {
      local_68 = (long)iVar2 * 0x50;
LAB_001f49f4:
      do {
        do {
          lVar6 = local_68;
          plVar8 = world->levels;
          pcVar10 = *(char **)((long)&plVar8->north + local_68);
          if (pcVar10 == (char *)0x0) {
            local_48 = (level_conflict *)0x0;
          }
          else {
            local_48 = level_by_name(world,pcVar10);
          }
          pcVar10 = *(char **)((long)&plVar8->east + lVar6);
          if (pcVar10 == (char *)0x0) {
            local_50 = (level_conflict *)0x0;
          }
          else {
            local_50 = level_by_name(world,pcVar10);
          }
          pcVar10 = *(char **)((long)&plVar8->south + lVar6);
          if (pcVar10 == (char *)0x0) {
            local_58 = (level_conflict *)0x0;
          }
          else {
            local_58 = level_by_name(world,pcVar10);
          }
          pcVar10 = *(char **)((long)&plVar8->west + lVar6);
          if (pcVar10 == (char *)0x0) {
            local_60 = (level_conflict *)0x0;
          }
          else {
            local_60 = level_by_name(world,pcVar10);
          }
          Term_fresh();
          Term_clear();
          p = mem_zalloc(100);
          *(int *)((long)p + 0x30) = iVar2;
          iVar5 = 0;
          do {
            uVar15 = 0;
            do {
              lVar6 = (long)*(int *)((long)p + uVar15 * 4);
              if (lVar6 != 0) {
                uVar14 = (uint)uVar15;
                plVar8 = world->levels;
                uVar4 = uVar14 - 5;
                if (uVar15 < 5) {
                  uVar4 = 0xffffffff;
                }
                cVar12 = (char)((uVar14 & 0xff) / 5) * -5 + (char)uVar15;
                if (((-1 < (int)uVar4) && (plVar8[lVar6].north != (char *)0x0)) &&
                   (*(int *)((long)p + (ulong)uVar4 * 4) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar6].north);
                  *(int *)((long)p + (ulong)uVar4 * 4) = plVar7->index;
                }
                if (((cVar12 != '\x04') && (plVar8[lVar6].east != (char *)0x0)) &&
                   (*(int *)((long)p + uVar15 * 4 + 4) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar6].east);
                  *(int *)((long)p + uVar15 * 4 + 4) = plVar7->index;
                }
                if (((uVar15 < 0x14) && (plVar8[lVar6].south != (char *)0x0)) &&
                   (*(int *)((long)p + uVar15 * 4 + 0x14) == 0)) {
                  plVar7 = level_by_name(world,plVar8[lVar6].south);
                  *(int *)((long)p + uVar15 * 4 + 0x14) = plVar7->index;
                }
                uVar4 = -(uint)(cVar12 == '\0') | uVar14 - 1;
                if (((-1 < (int)uVar4) && (plVar8[lVar6].west != (char *)0x0)) &&
                   (*(int *)((long)p + (ulong)uVar4 * 4) == 0)) {
                  plVar8 = level_by_name(world,plVar8[lVar6].west);
                  *(int *)((long)p + (ulong)uVar4 * 4) = plVar8->index;
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != 0x19);
            iVar5 = iVar5 + 1;
          } while (iVar5 != 5);
          cVar12 = '\0';
          lVar6 = 0;
          do {
            lVar9 = (long)*(int *)((long)p + lVar6 * 4);
            if (lVar9 != 0) {
              bVar11 = cVar12 + (char)(((uint)lVar6 & 0xff) / 5) * -0x5a;
              local_40 = (ulong)bVar11;
              col = bVar11 | 1;
              uVar4 = ((uint)lVar6 & 0xff) / 5;
              pcVar10 = format("Level %d",(ulong)(uint)world->levels[lVar9].depth);
              print_map_name(*(wchar_t *)((long)p + lVar6 * 4),uVar4 * 4 + L'\x01',col,false);
              uVar15 = local_40;
              wVar3 = uVar4 * 4 + L'\x02';
              uVar13 = '\b';
              if (lVar6 == 0xc) {
                uVar13 = '\x01';
              }
              c_put_str(uVar13,pcVar10,wVar3,col);
              plVar8 = world->levels;
              lVar9 = (long)*(int *)((long)p + lVar6 * 4);
              iVar5 = (int)uVar15;
              if (plVar8[lVar9].east != (char *)0x0) {
                c_put_str('\x01',"   ---",wVar3,iVar5 + L'\t');
                plVar8 = world->levels;
                lVar9 = (long)*(int *)((long)p + lVar6 * 4);
              }
              uVar4 = uVar4 * 4;
              if ((plVar8[lVar9].down != (char *)0x0) &&
                 ((plVar8 = level_by_name(world,plVar8[lVar9].down),
                  plVar8->topography == TOP_MOUNTAINTOP || (plVar8->locality != LOC_UNDERWORLD)))) {
                print_map_name(plVar8->index,uVar4 | 3,col,true);
              }
              plVar8 = world->levels;
              lVar9 = (long)*(int *)((long)p + lVar6 * 4);
              if (plVar8[lVar9].south != (char *)0x0) {
                c_put_str('\x01',"|",uVar4 + L'\x04',iVar5 + L'\x04');
                plVar8 = world->levels;
                lVar9 = (long)*(int *)((long)p + lVar6 * 4);
              }
              if ((plVar8[lVar9].south != (char *)0x0) && (plVar8[lVar9].down == (char *)0x0)) {
                c_put_str('\x01',"|",uVar4 | 3,iVar5 + L'\x04');
              }
            }
            lVar6 = lVar6 + 1;
            cVar12 = cVar12 + '\x12';
          } while (lVar6 != 0x19);
          mem_free(p);
          put_str("Move keys to scroll, other input to continue",local_70 + L'\xffffffff',
                  (local_6c - (local_6c + -0x28 >> 0x1f)) + -0x28 >> 1);
          uVar16 = inkey_ex();
          switch(uVar16.key.code) {
          case 0x68:
            goto switchD_001f4e26_caseD_81;
          case 0x69:
            goto switchD_001f4e26_default;
          case 0x6a:
switchD_001f4e26_caseD_80:
            plVar8 = local_58;
            break;
          case 0x6b:
switchD_001f4e26_caseD_83:
            plVar8 = local_48;
            if (local_48 != (level_conflict *)0x0) goto LAB_001f4e76;
            goto LAB_001f49f4;
          case 0x6c:
switchD_001f4e26_caseD_82:
            plVar8 = local_50;
            break;
          default:
            switch(uVar16.key.code) {
            case 0x80:
              goto switchD_001f4e26_caseD_80;
            case 0x81:
switchD_001f4e26_caseD_81:
              plVar8 = local_60;
              break;
            case 0x82:
              goto switchD_001f4e26_caseD_82;
            case 0x83:
              goto switchD_001f4e26_caseD_83;
            default:
              goto switchD_001f4e26_default;
            }
          }
        } while (plVar8 == (level_conflict *)0x0);
LAB_001f4e76:
        iVar5 = plVar8->index;
      } while (iVar5 == 0);
      iVar2 = iVar5;
    } while (iVar5 != -1);
  }
switchD_001f4e26_default:
  screen_load();
  return;
}

Assistant:

void do_cmd_view_map(void)
{
	int cy, cx;
	uint8_t w, h;
	const char *prompt = "Hit any key to continue";
	/* variables for regional map */
	int wid, hgt;
	int num_down, num_across, num, centre_place, next_place;
	ui_event ke;

	//if (Term->view_map_hook) {
	//	(*(Term->view_map_hook))(Term);
	//	return;
	//}

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Get dimensions for the regional map */
	num_down = (hgt - 6) / 8;
	num_across = (wid - 24) / 20;
	num = (num_down < num_across ? num_down : num_across);

	/* Hack - limit range for now */
	num = 2;

	/* Save screen */
	screen_save();

	/* Note */
	prt("Please wait...", 0, 0);

	/* Flush */
	Term_fresh();

	/* Clear the screen */
	Term_clear();

	/* store the tile multipliers */
	w = tile_width;
	h = tile_height;
	tile_width = 1;
	tile_height = 1;

	/* Display the map */
	display_map(&cy, &cx);

	/* Show the prompt */
	put_str(prompt, Term->hgt - 1, Term->wid / 2 - strlen(prompt) / 2);

	/* Highlight the player */
	Term_gotoxy(cx, cy);

	/* Get any key */
	(void)anykey();

	/* Restore the tile multipliers */
	tile_width = w;
	tile_height = h;

	/* Show regional map only if there is wilderness */
	if (!streq(world->name, "Hybrid Dungeon") &&
		!streq(world->name, "Angband Dungeon") &&
		(level_topography(player->place) != TOP_CAVE)) {
		centre_place = player->place;
		while (true) {
			/* Get the adjacent levels */
			struct level *lev = &world->levels[centre_place];
			struct level *north = NULL;
			struct level *east = NULL;
			struct level *south = NULL;
			struct level *west = NULL;
			if (lev->north) north = level_by_name(world, lev->north);
			if (lev->east) east = level_by_name(world, lev->east);
			if (lev->south) south = level_by_name(world, lev->south);
			if (lev->west) west = level_by_name(world, lev->west);

			/* Flush */
			Term_fresh();

			/* Clear the screen */
			Term_clear();

			/* Display the regional map */
			regional_map(num, centre_place);

			/* Wait for it */
			put_str("Move keys to scroll, other input to continue",
					hgt - 1, (wid - 40) / 2);

			/* Get any key */
			ke = inkey_ex();
			next_place = -1;
			switch (ke.key.code) {
			case 'k':
			case ARROW_UP:
				next_place = north ? north->index : 0;
				break;
			case 'j':
			case ARROW_DOWN:
				next_place = south ? south->index : 0;
				break;
			case 'h':
			case ARROW_LEFT:
				next_place = west ? west->index : 0;
				break;
			case 'l':
			case ARROW_RIGHT:
				next_place = east ? east->index : 0;
				break;
			}
			if (next_place == -1)
				break;
			if (next_place)
				centre_place = next_place;
		}
	}

	/* Load screen */
	screen_load();
}